

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql_statement.hpp
# Opt level: O3

void __thiscall
duckdb::ExtensionStatement::ExtensionStatement
          (ExtensionStatement *this,ParserExtension *extension_p,
          unique_ptr<duckdb::ParserExtensionParseData,_std::default_delete<duckdb::ParserExtensionParseData>,_true>
          *parse_data_p)

{
  plan_function_t p_Var1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  (this->super_SQLStatement).type = EXTENSION_STATEMENT;
  (this->super_SQLStatement).stmt_location = 0;
  (this->super_SQLStatement).stmt_length = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_buckets =
       &(this->super_SQLStatement).named_param_map._M_h._M_single_bucket;
  (this->super_SQLStatement).named_param_map._M_h._M_bucket_count = 1;
  (this->super_SQLStatement).named_param_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_SQLStatement).named_param_map._M_h._M_element_count = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_SQLStatement).query._M_dataplus._M_p =
       (pointer)&(this->super_SQLStatement).query.field_2;
  (this->super_SQLStatement).query._M_string_length = 0;
  (this->super_SQLStatement).query.field_2._M_local_buf[0] = '\0';
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__ExtensionStatement_01981c68;
  p_Var1 = extension_p->plan_function;
  (this->extension).parse_function = extension_p->parse_function;
  (this->extension).plan_function = p_Var1;
  (this->extension).parser_info.internal.
  super___shared_ptr<duckdb::ParserExtensionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (extension_p->parser_info).internal.
           super___shared_ptr<duckdb::ParserExtensionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (extension_p->parser_info).internal.
           super___shared_ptr<duckdb::ParserExtensionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (extension_p->parser_info).internal.
  super___shared_ptr<duckdb::ParserExtensionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->extension).parser_info.internal.
  super___shared_ptr<duckdb::ParserExtensionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->extension).parser_info.internal.
  super___shared_ptr<duckdb::ParserExtensionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  (extension_p->parser_info).internal.
  super___shared_ptr<duckdb::ParserExtensionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->parse_data).
  super_unique_ptr<duckdb::ParserExtensionParseData,_std::default_delete<duckdb::ParserExtensionParseData>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ParserExtensionParseData,_std::default_delete<duckdb::ParserExtensionParseData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ParserExtensionParseData_*,_std::default_delete<duckdb::ParserExtensionParseData>_>
  .super__Head_base<0UL,_duckdb::ParserExtensionParseData_*,_false>._M_head_impl =
       (parse_data_p->
       super_unique_ptr<duckdb::ParserExtensionParseData,_std::default_delete<duckdb::ParserExtensionParseData>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::ParserExtensionParseData,_std::default_delete<duckdb::ParserExtensionParseData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParserExtensionParseData_*,_std::default_delete<duckdb::ParserExtensionParseData>_>
       .super__Head_base<0UL,_duckdb::ParserExtensionParseData_*,_false>._M_head_impl;
  (parse_data_p->
  super_unique_ptr<duckdb::ParserExtensionParseData,_std::default_delete<duckdb::ParserExtensionParseData>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::ParserExtensionParseData,_std::default_delete<duckdb::ParserExtensionParseData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ParserExtensionParseData_*,_std::default_delete<duckdb::ParserExtensionParseData>_>
  .super__Head_base<0UL,_duckdb::ParserExtensionParseData_*,_false>._M_head_impl =
       (ParserExtensionParseData *)0x0;
  return;
}

Assistant:

explicit SQLStatement(StatementType type) : type(type) {
	}